

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section_helper.hpp
# Opt level: O2

string * export_section<(pstore::repo::section_kind)2>
                   (string *__return_storage_ptr__,database *db,string_mapping *exported_strings,
                   section_content *content,bool comments)

{
  string *psVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  ostringstream os;
  undefined8 local_90;
  undefined1 local_88 [24];
  not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*> local_70;
  ostringstream local_68;
  
  local_70.ptr_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_88;
  local_88._16_8_ = (pointer)0x0;
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = (pointer)0x0;
  pstore::gsl::not_null<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*>::
  ensure_invariant(&local_70);
  build_section<(pstore::repo::section_kind)2,pstore::repo::bss_section,pstore::repo::bss_section_creation_dispatcher>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90,
             (section_content *)local_70.ptr_);
  pstore::exchange::export_ns::ostringstream::ostringstream(&local_68);
  pstore::exchange::export_ns::operator()(&local_68,0,local_90);
  psVar1 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&local_68);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&local_68);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string export_section (pstore::database const & db,
                            pstore::exchange::export_ns::string_mapping const & exported_strings,
                            pstore::repo::section_content const & content, bool comments) {
    // First build the section that we want to export.
    std::vector<std::uint8_t> buffer;
    auto const section = build_section<Kind> (&buffer, content);

    // Now export it.
    using namespace pstore::exchange::export_ns;
    ostringstream os;
    emit_section<Kind> (os, indent{}, db, exported_strings, *section, comments);
    return os.str ();
}